

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O0

int pfl_accepting(Plug *p,accept_fn_t constructor,accept_ctx_t ctx)

{
  Plug *pfchan;
  PlugVtable *s_00;
  char *pcVar1;
  ChannelVtable *pCVar2;
  SshChannel *sc;
  char *err;
  Socket *s;
  Plug *plug;
  Channel *chan;
  PortForwarding *pf;
  PortListener *pl;
  accept_fn_t constructor_local;
  Plug *p_local;
  accept_ctx_t ctx_local;
  
  pf = (PortForwarding *)(p + -5);
  pl = (PortListener *)constructor;
  constructor_local = (accept_fn_t)p;
  p_local = (Plug *)ctx;
  plug = (Plug *)portfwd_raw_new((ConnectionLayer *)pf->c,(Plug **)&s,false);
  s_00 = (PlugVtable *)(*(code *)pl)(p_local);
  pcVar1 = sk_socket_error((Socket *)s_00);
  if (pcVar1 == (char *)0x0) {
    chan = (Channel *)(plug + -9);
    if (((ulong)pf->s & 1) == 0) {
      pCVar2 = (ChannelVtable *)dupstr(*(char **)&pf->input_wanted);
      pfchan = plug;
      chan[2].vt = pCVar2;
      chan[2].initial_fixed_window_size = *(uint *)&pf->hostname;
      sc = wrap_lportfwd_open((ConnectionLayer *)pf->c,(char *)chan[2].vt,
                              chan[2].initial_fixed_window_size,(Socket *)s_00,
                              (Channel *)&chan[4].initial_fixed_window_size);
      portfwd_raw_setup((Channel *)pfchan,(Socket *)s_00,sc);
    }
    else {
      plug[-7].vt = s_00;
      *(undefined4 *)((long)&plug[-6].vt + 4) = 1;
      pCVar2 = (ChannelVtable *)strbuf_new();
      chan[3].vt = pCVar2;
      *(undefined8 *)&chan[3].initial_fixed_window_size = 0;
      chan[2].initial_fixed_window_size = 0;
      sk_set_frozen((Socket *)s_00,false);
    }
    ctx_local._4_4_ = 0;
  }
  else {
    portfwd_raw_free((Channel *)plug);
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

static int pfl_accepting(Plug *p, accept_fn_t constructor, accept_ctx_t ctx)
{
    struct PortListener *pl = container_of(p, struct PortListener, plug);
    struct PortForwarding *pf;
    Channel *chan;
    Plug *plug;
    Socket *s;
    const char *err;

    chan = portfwd_raw_new(pl->cl, &plug, false);
    s = constructor(ctx, plug);
    if ((err = sk_socket_error(s)) != NULL) {
        portfwd_raw_free(chan);
        return 1;
    }

    pf = container_of(chan, struct PortForwarding, chan);

    if (pl->is_dynamic) {
        pf->s = s;
        pf->socks_state = SOCKS_INITIAL;
        pf->socksbuf = strbuf_new();
        pf->socksbuf_consumed = 0;
        pf->port = 0;                  /* "hostname" buffer is so far empty */
        sk_set_frozen(s, false);       /* we want to receive SOCKS _now_! */
    } else {
        pf->hostname = dupstr(pl->hostname);
        pf->port = pl->port;
        portfwd_raw_setup(
            chan, s,
            wrap_lportfwd_open(pl->cl, pf->hostname, pf->port, s, &pf->chan));
    }

    return 0;
}